

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmBreak(ExpressionContext *ctx,VmModule *module,ExprBreak *node)

{
  uint uVar1;
  LoopInfo *pLVar2;
  VmValue *pVVar3;
  VmBlock *target;
  ExprBreak *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  uVar1 = SmallArray<VmModule::LoopInfo,_32U>::size(&module->loopInfo);
  pLVar2 = SmallArray<VmModule::LoopInfo,_32U>::operator[]
                     (&module->loopInfo,uVar1 - *(int *)&(node->super_ExprBase).field_0x2c);
  anon_unknown.dwarf_1a3010::CreateJump
            (module,(node->super_ExprBase).source,&pLVar2->breakBlock->super_VmValue);
  pVVar3 = anon_unknown.dwarf_1a3010::CreateVoid(module);
  pVVar3 = anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmBreak(ExpressionContext &ctx, VmModule *module, ExprBreak *node)
{
	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *target = module->loopInfo[module->loopInfo.size() - node->depth].breakBlock;

	CreateJump(module, node->source, target);

	return CheckType(ctx, node, CreateVoid(module));
}